

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalability_test.c
# Opt level: O1

int transact(nng_socket *clients,int num)

{
  int iVar1;
  ulong uVar2;
  nng_msg *local_30;
  nng_msg *msg;
  
  if (num < 1) {
    return 0;
  }
  uVar2 = 0;
  do {
    iVar1 = nng_msg_alloc(&local_30,0);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = nng_sendmsg((nng_socket)clients[uVar2].id,local_30,0);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = nng_recvmsg((nng_socket)clients[uVar2].id,&local_30,0);
    if (iVar1 != 0) {
      return iVar1;
    }
    nng_msg_free(local_30);
    local_30 = (nng_msg *)0x0;
    uVar2 = uVar2 + 1;
  } while ((uint)num != uVar2);
  return 0;
}

Assistant:

int
transact(nng_socket *clients, int num)
{
	nng_msg *msg;
	int      rv = 0;
	int      i;

	for (i = 0; i < num; i++) {

		if (((rv = nng_msg_alloc(&msg, 0)) != 0) ||
		    ((rv = nng_sendmsg(clients[i], msg, 0)) != 0) ||
		    ((rv = nng_recvmsg(clients[i], &msg, 0)) != 0)) {
			// We may leak a message, but this is an
			// error case anyway.
			break;
		}
		nng_msg_free(msg);
		msg = NULL;
	}
	return (rv);
}